

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

void __thiscall soul::AST::StructDeclaration::~StructDeclaration(StructDeclaration *this)

{
  bool bVar1;
  Structure *pSVar2;
  StructDeclaration *this_local;
  
  (this->super_TypeDeclarationBase).super_Expression.super_Statement.super_ASTObject._vptr_ASTObject
       = (_func_int **)&PTR__StructDeclaration_00586a98;
  bVar1 = RefCountedPtr<soul::Structure>::operator!=(&this->structure,(Structure *)0x0);
  if (bVar1) {
    pSVar2 = RefCountedPtr<soul::Structure>::operator->(&this->structure);
    pSVar2->backlinkToASTObject = (void *)0x0;
  }
  ArrayWithPreallocation<soul::AST::StructDeclaration::Member,_16UL>::~ArrayWithPreallocation
            (&this->members);
  RefCountedPtr<soul::Structure>::~RefCountedPtr(&this->structure);
  TypeDeclarationBase::~TypeDeclarationBase(&this->super_TypeDeclarationBase);
  return;
}

Assistant:

~StructDeclaration() override
        {
            if (structure != nullptr)
                structure->backlinkToASTObject = nullptr;
        }